

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void raviV_op_band(lua_State *L,TValue *ra,TValue *rb,TValue *rc)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  TValue *io;
  TValue *pTVar4;
  ushort uVar5;
  ushort uVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar6 = rb->tt_;
  uVar7 = (ulong)uVar6;
  uVar5 = 1;
  pTVar4 = ra;
  if (uVar6 == 3) {
    dVar1 = (rb->value_).n;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar1;
    auVar9 = vroundsd_avx(auVar9,auVar9,9);
    dVar8 = auVar9._0_8_;
    if ((dVar8 == dVar1) && (!NAN(dVar8) && !NAN(dVar1))) {
      uVar2 = vcmppd_avx512vl(auVar9,ZEXT816(0x43e0000000000000),5);
      uVar3 = vcmppd_avx512vl(ZEXT816(0xc3e0000000000000),auVar9,6);
      uVar5 = (ushort)uVar3 & 3 | (ushort)uVar2 & 3;
      pTVar4 = (TValue *)(long)dVar8;
    }
LAB_00130b1f:
    if ((uVar5 & 1) != 0) goto LAB_00130b81;
  }
  else {
    if (uVar6 != 0x13) goto LAB_00130b1f;
    pTVar4 = (TValue *)(rb->value_).i;
  }
  uVar6 = 1;
  if (rc->tt_ == 3) {
    dVar1 = (rc->value_).n;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar1;
    auVar9 = vroundsd_avx(auVar10,auVar10,9);
    dVar8 = auVar9._0_8_;
    if ((dVar8 == dVar1) && (!NAN(dVar8) && !NAN(dVar1))) {
      uVar2 = vcmppd_avx512vl(auVar9,ZEXT816(0x43e0000000000000),5);
      uVar3 = vcmppd_avx512vl(ZEXT816(0xc3e0000000000000),auVar9,6);
      uVar6 = (ushort)uVar3 & 3 | (ushort)uVar2 & 3;
      uVar7 = (ulong)dVar8;
    }
  }
  else if (rc->tt_ == 0x13) {
    uVar7 = (rc->value_).i;
    goto LAB_00130b95;
  }
  if ((uVar6 & 1) != 0) {
LAB_00130b81:
    luaT_trybinTM(L,rb,rc,ra,TM_BAND);
    return;
  }
LAB_00130b95:
  (ra->value_).i = uVar7 & (ulong)pTVar4;
  ra->tt_ = 0x13;
  return;
}

Assistant:

void raviV_op_band(lua_State *L, TValue *ra, TValue *rb, TValue *rc) {
  lua_Integer ib;
  lua_Integer ic;
  if (tointegerns(rb, &ib) && tointegerns(rc, &ic)) {
    setivalue(ra, intop(&, ib, ic));
  }
  else {
    luaT_trybinTM(L, rb, rc, ra, TM_BAND);
  }
}